

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_echocli.cpp
# Opt level: O3

void AddSuccCnt(void)

{
  time_t tVar1;
  int iVar2;
  
  iVar2 = 0;
  tVar1 = time((time_t *)0x0);
  if (iTime < (int)tVar1) {
    printf("time %d Succ Cnt %d Fail Cnt %d\n",(ulong)(uint)iTime,(ulong)(uint)iSuccCnt,
           (ulong)(uint)iFailCnt);
    iFailCnt = 0;
    iTime = (int)tVar1;
  }
  else {
    iVar2 = iSuccCnt + 1;
  }
  iSuccCnt = iVar2;
  return;
}

Assistant:

void AddSuccCnt()
{
	int now = time(NULL);
	if (now >iTime)
	{
		printf("time %d Succ Cnt %d Fail Cnt %d\n", iTime, iSuccCnt, iFailCnt);
		iTime = now;
		iSuccCnt = 0;
		iFailCnt = 0;
	}
	else
	{
		iSuccCnt++;
	}
}